

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidateGraphicsPipelineCreateInfo
               (GraphicsPipelineStateCreateInfo *CreateInfo,IRenderDevice *pDevice)

{
  undefined *puVar1;
  int iVar2;
  Char *pCVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TextureFormatAttribs *Args;
  undefined8 uVar5;
  char (*in_RCX) [19];
  PIPELINE_SHADING_RATE_FLAGS Flags;
  char *in_stack_fffffffffffffc58;
  char *local_348;
  char *local_340;
  char *local_330;
  char *local_328;
  TextureFormatAttribs *local_320;
  char *local_300;
  RenderPassDesc *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2c0;
  char *local_2b0;
  GraphicsPipelineDesc *local_2a8;
  String local_298;
  char *local_278;
  char *local_270;
  uint local_264;
  char *local_260;
  char *local_258;
  undefined1 local_250 [8];
  string _msg;
  TEXTURE_FORMAT RTVFmt_1;
  char *pcStack_228;
  Uint32 rt_2;
  char *local_220;
  char *local_218;
  char *local_210;
  TextureFormatAttribs *local_208;
  TextureFormatAttribs *FmtAttribs_1;
  char *local_1f8;
  TextureFormatAttribs *local_1f0;
  TextureFormatAttribs *FmtAttribs;
  uint uStack_1e0;
  TEXTURE_FORMAT RTVFmt;
  Uint32 rt_1;
  char *local_1d8;
  char *local_1d0;
  char **local_1c8;
  RenderPassDesc *RPDesc;
  char *local_1b8;
  uint local_1ac;
  char *pcStack_1a8;
  Uint32 rt;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  Char *local_178;
  Char *local_170;
  Char *local_168;
  Char *local_160;
  Char *local_158;
  Char *local_150;
  Char *local_148;
  undefined1 local_140 [8];
  string msg_4;
  string msg_3;
  string msg_2;
  char *local_d8;
  undefined1 local_d0 [8];
  string msg_1;
  char *local_a8;
  GraphicsPipelineDesc *local_a0;
  GraphicsPipelineDesc *GraphicsPipeline;
  char *local_90;
  GraphicsPipelineStateCreateInfo *local_88;
  PipelineStateDesc *PSODesc;
  GraphicsAdapterInfo *AdapterInfo;
  DeviceFeatures *Features;
  undefined1 local_60 [8];
  string msg;
  IRenderDevice *pDevice_local;
  GraphicsPipelineStateCreateInfo *CreateInfo_local;
  
  msg.field_2._8_8_ = pDevice;
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcc143e,
               in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x22a);
    std::__cxx11::string::~string((string *)local_60);
  }
  lVar4 = (**(code **)(*(long *)msg.field_2._8_8_ + 0xc0))();
  AdapterInfo = (GraphicsAdapterInfo *)(lVar4 + 0xc);
  PSODesc = (PipelineStateDesc *)(**(code **)(*(long *)msg.field_2._8_8_ + 200))();
  local_88 = CreateInfo;
  if (((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_GRAPHICS)
     && ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_MESH)) {
    local_90 = GetPipelineTypeString
                         ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
        (Char *)0x0) {
      local_2a8 = (GraphicsPipelineDesc *)0xc361e0;
    }
    else {
      local_2a8 = (GraphicsPipelineDesc *)
                  (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    }
    GraphicsPipeline = local_2a8;
    in_stack_fffffffffffffc58 = " PSO \'";
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[40]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x230,(char (*) [16])"Description of ",&local_90,(char (*) [7])0xc0e54c,
               (char **)&GraphicsPipeline,(char (*) [15])"\' is invalid: ",
               (char (*) [40])"Pipeline type must be GRAPHICS or MESH.");
  }
  ValidatePipelineResourceSignatures
            (&CreateInfo->super_PipelineStateCreateInfo,(IRenderDevice *)msg.field_2._8_8_);
  local_a0 = &CreateInfo->GraphicsPipeline;
  ValidateBlendStateDesc((PipelineStateDesc *)local_88,local_a0);
  ValidateRasterizerStateDesc((PipelineStateDesc *)local_88,local_a0,(DeviceFeatures *)AdapterInfo);
  ValidateDepthStencilDesc((PipelineStateDesc *)local_88,local_a0);
  ValidateGraphicsPipelineDesc
            ((PipelineStateDesc *)local_88,local_a0,(ShadingRateProperties *)(PSODesc + 5));
  ValidatePipelineResourceLayoutDesc((PipelineStateDesc *)local_88,(DeviceFeatures *)AdapterInfo);
  if ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType == PIPELINE_TYPE_GRAPHICS) {
    if (CreateInfo->pVS == (IShader *)0x0) {
      local_a8 = GetPipelineTypeString
                           ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
          (Char *)0x0) {
        local_2b0 = "";
      }
      else {
        local_2b0 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name
        ;
      }
      msg_1.field_2._8_8_ = local_2b0;
      in_stack_fffffffffffffc58 = " PSO \'";
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[32]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x240,(char (*) [16])"Description of ",&local_a8,(char (*) [7])0xc0e54c,
                 (char **)((long)&msg_1.field_2 + 8),(char (*) [15])"\' is invalid: ",
                 (char (*) [32])"Vertex shader must not be null.");
    }
    if ((CreateInfo->pAS != (IShader *)0x0) || (CreateInfo->pMS != (IShader *)0x0)) {
      FormatString<char[53]>
                ((string *)local_d0,
                 (char (*) [53])"Mesh shaders are not supported in graphics pipeline.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x242);
      std::__cxx11::string::~string((string *)local_d0);
    }
  }
  else if ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType == PIPELINE_TYPE_MESH) {
    if (CreateInfo->pMS == (IShader *)0x0) {
      local_d8 = GetPipelineTypeString
                           ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
          (Char *)0x0) {
        local_2c0 = "";
      }
      else {
        local_2c0 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name
        ;
      }
      msg_2.field_2._8_8_ = local_2c0;
      in_stack_fffffffffffffc58 = " PSO \'";
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[30]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x247,(char (*) [16])"Description of ",&local_d8,(char (*) [7])0xc0e54c,
                 (char **)((long)&msg_2.field_2 + 8),(char (*) [15])"\' is invalid: ",
                 (char (*) [30])"Mesh shader must not be null.");
    }
    if ((((CreateInfo->pVS != (IShader *)0x0) || (CreateInfo->pGS != (IShader *)0x0)) ||
        (CreateInfo->pDS != (IShader *)0x0)) || (CreateInfo->pHS != (IShader *)0x0)) {
      FormatString<char[80]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [80])
                 "Vertex, geometry and tessellation shaders are not supported in a mesh pipeline.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x24a);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    if ((local_a0->InputLayout).NumElements != 0) {
      FormatString<char[44]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [44])"Input layout is ignored in a mesh pipeline.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x24b);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    if ((local_a0->PrimitiveTopology != PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) &&
       (local_a0->PrimitiveTopology != PRIMITIVE_TOPOLOGY_UNDEFINED)) {
      FormatString<char[109]>
                ((string *)local_140,
                 (char (*) [109])
                 "Primitive topology is ignored in a mesh pipeline, set it to undefined or keep default value (triangle list)."
                );
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x24e);
      std::__cxx11::string::~string((string *)local_140);
    }
  }
  if ((CreateInfo->pVS != (IShader *)0x0) &&
     (iVar2 = (*(CreateInfo->pVS->super_IDeviceObject).super_IObject._vptr_IObject[4])(),
     *(int *)(CONCAT44(extraout_var,iVar2) + 8) != 1)) {
    iVar2 = (*(CreateInfo->pVS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_148 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_00,iVar2) + 8));
    in_stack_fffffffffffffc58 = "vertex";
    LogError<true,char_const*,char[26],char[7],char[8]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x252,&local_148,(char (*) [26])" is not a valid type for ",(char (*) [7])0xccfaac,
               (char (*) [8])0xcc12ef);
  }
  if ((CreateInfo->pPS != (IShader *)0x0) &&
     (iVar2 = (*(CreateInfo->pPS->super_IDeviceObject).super_IObject._vptr_IObject[4])(),
     *(int *)(CONCAT44(extraout_var_01,iVar2) + 8) != 2)) {
    iVar2 = (*(CreateInfo->pPS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_150 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_02,iVar2) + 8));
    in_stack_fffffffffffffc58 = "pixel";
    LogError<true,char_const*,char[26],char[6],char[8]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x253,&local_150,(char (*) [26])" is not a valid type for ",(char (*) [6])"pixel",
               (char (*) [8])0xcc12ef);
  }
  if ((CreateInfo->pGS != (IShader *)0x0) &&
     (iVar2 = (*(CreateInfo->pGS->super_IDeviceObject).super_IObject._vptr_IObject[4])(),
     *(int *)(CONCAT44(extraout_var_03,iVar2) + 8) != 4)) {
    iVar2 = (*(CreateInfo->pGS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_158 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_04,iVar2) + 8));
    in_stack_fffffffffffffc58 = "geometry";
    LogError<true,char_const*,char[26],char[9],char[8]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x254,&local_158,(char (*) [26])" is not a valid type for ",(char (*) [9])"geometry"
               ,(char (*) [8])0xcc12ef);
  }
  if ((CreateInfo->pHS != (IShader *)0x0) &&
     (iVar2 = (*(CreateInfo->pHS->super_IDeviceObject).super_IObject._vptr_IObject[4])(),
     *(int *)(CONCAT44(extraout_var_05,iVar2) + 8) != 8)) {
    iVar2 = (*(CreateInfo->pHS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_160 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_06,iVar2) + 8));
    in_stack_fffffffffffffc58 = "hull";
    LogError<true,char_const*,char[26],char[5],char[8]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x255,&local_160,(char (*) [26])" is not a valid type for ",(char (*) [5])"hull",
               (char (*) [8])0xcc12ef);
  }
  if ((CreateInfo->pDS != (IShader *)0x0) &&
     (iVar2 = (*(CreateInfo->pDS->super_IDeviceObject).super_IObject._vptr_IObject[4])(),
     *(int *)(CONCAT44(extraout_var_07,iVar2) + 8) != 0x10)) {
    iVar2 = (*(CreateInfo->pDS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_168 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_08,iVar2) + 8));
    in_stack_fffffffffffffc58 = "domain";
    LogError<true,char_const*,char[26],char[7],char[8]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x256,&local_168,(char (*) [26])" is not a valid type for ",(char (*) [7])0xc6426c,
               (char (*) [8])0xcc12ef);
  }
  if ((CreateInfo->pAS != (IShader *)0x0) &&
     (iVar2 = (*(CreateInfo->pAS->super_IDeviceObject).super_IObject._vptr_IObject[4])(),
     *(int *)(CONCAT44(extraout_var_09,iVar2) + 8) != 0x40)) {
    iVar2 = (*(CreateInfo->pAS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_170 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_10,iVar2) + 8));
    in_stack_fffffffffffffc58 = "amplification";
    LogError<true,char_const*,char[26],char[14],char[8]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,599,&local_170,(char (*) [26])" is not a valid type for ",
               (char (*) [14])"amplification",(char (*) [8])0xcc12ef);
  }
  if ((CreateInfo->pMS != (IShader *)0x0) &&
     (iVar2 = (*(CreateInfo->pMS->super_IDeviceObject).super_IObject._vptr_IObject[4])(),
     *(int *)(CONCAT44(extraout_var_11,iVar2) + 8) != 0x80)) {
    iVar2 = (*(CreateInfo->pMS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_178 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_12,iVar2) + 8));
    in_stack_fffffffffffffc58 = "mesh";
    LogError<true,char_const*,char[26],char[5],char[8]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,600,&local_178,(char (*) [26])" is not a valid type for ",(char (*) [5])"mesh",
               (char (*) [8])0xcc12ef);
  }
  if (local_a0->pRenderPass == (IRenderPass *)0x0) {
    for (FmtAttribs._4_4_ = 0; FmtAttribs._4_4_ < local_a0->NumRenderTargets;
        FmtAttribs._4_4_ = FmtAttribs._4_4_ + 1) {
      FmtAttribs._2_2_ = local_a0->RTVFormats[FmtAttribs._4_4_];
      if ((FmtAttribs._2_2_ != TEX_FORMAT_UNKNOWN) &&
         (((local_1f0 = GetTextureFormatAttribs(FmtAttribs._2_2_),
           local_1f0->ComponentType == COMPONENT_TYPE_DEPTH ||
           (local_1f0->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)) ||
          (local_1f0->ComponentType == COMPONENT_TYPE_COMPRESSED)))) {
        local_1f8 = GetPipelineTypeString
                              ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
        if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
            (Char *)0x0) {
          local_320 = (TextureFormatAttribs *)0xc361e0;
        }
        else {
          local_320 = (TextureFormatAttribs *)
                      (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                      Name;
        }
        FmtAttribs_1 = local_320;
        in_stack_fffffffffffffc58 = " PSO \'";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[8],char_const*,char[24],unsigned_int,char[66]>
                  (false,"ValidateGraphicsPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x27c,(char (*) [16])"Description of ",&local_1f8,(char (*) [7])0xc0e54c,
                   (char **)&FmtAttribs_1,(char (*) [15])"\' is invalid: ",(char (*) [8])"Format ",
                   &local_1f0->Name,(char (*) [24])" of render target slot ",
                   (uint *)((long)&FmtAttribs + 4),
                   (char (*) [66])
                   " is invalid: depth-stencil or compressed formats are not allowed.");
      }
    }
    if (local_a0->DSVFormat != TEX_FORMAT_UNKNOWN) {
      local_208 = GetTextureFormatAttribs(local_a0->DSVFormat);
      if ((local_208->ComponentType != COMPONENT_TYPE_DEPTH) &&
         (local_208->ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)) {
        local_210 = GetPipelineTypeString
                              ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
        if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
            (Char *)0x0) {
          local_328 = "";
        }
        else {
          local_328 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                      Name;
        }
        local_218 = local_328;
        in_stack_fffffffffffffc58 = " PSO \'";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char_const*,char[37]>
                  (false,"ValidateGraphicsPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x286,(char (*) [16])"Description of ",&local_210,(char (*) [7])0xc0e54c,
                   &local_218,(char (*) [15])"\' is invalid: ",&local_208->Name,
                   (char (*) [37])0xccad22);
      }
      if (((local_a0->ReadOnlyDSV & 1U) != 0) &&
         (((local_a0->DepthStencilDesc).DepthWriteEnable & 1U) != 0)) {
        local_220 = GetPipelineTypeString
                              ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
        if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
            (Char *)0x0) {
          local_330 = "";
        }
        else {
          local_330 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                      Name;
        }
        pcStack_228 = local_330;
        in_stack_fffffffffffffc58 = " PSO \'";
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[74]>
                  (false,"ValidateGraphicsPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x28a,(char (*) [16])"Description of ",&local_220,(char (*) [7])0xc0e54c,
                   &stack0xfffffffffffffdd8,(char (*) [15])"\' is invalid: ",
                   (char (*) [74])
                   "DepthStencilDesc.DepthWriteEnable can\'t be true when ReadOnlyDSV is true.");
      }
    }
    for (_msg.field_2._12_4_ = ZEXT14(local_a0->NumRenderTargets); (uint)_msg.field_2._12_4_ < 8;
        _msg.field_2._12_4_ = _msg.field_2._12_4_ + 1) {
      _msg.field_2._10_2_ = local_a0->RTVFormats[(uint)_msg.field_2._12_4_];
      if (_msg.field_2._10_2_ != TEX_FORMAT_UNKNOWN) {
        Args = GetTextureFormatAttribs(_msg.field_2._10_2_);
        FormatString<char[23],char_const*,char[18],unsigned_int,char[36]>
                  ((string *)local_250,(Diligent *)"Render target format (",(char (*) [23])Args,
                   (char **)") of unused slot ",(char (*) [18])((long)&_msg.field_2 + 0xc),
                   (uint *)" must be set to TEX_FORMAT_UNKNOWN.",
                   (char (*) [36])in_stack_fffffffffffffc58);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar5 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(1,uVar5,0);
        }
        std::__cxx11::string::~string((string *)local_250);
      }
    }
    if (local_a0->SubpassIndex != '\0') {
      local_258 = GetPipelineTypeString
                            ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
          (Char *)0x0) {
        local_340 = "";
      }
      else {
        local_340 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name
        ;
      }
      local_260 = local_340;
      local_264 = (uint)local_a0->SubpassIndex;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[16],unsigned_int,char[51]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x298,(char (*) [16])"Description of ",&local_258,(char (*) [7])0xc0e54c,
                 &local_260,(char (*) [15])"\' is invalid: ",(char (*) [16])"Subpass index (",
                 &local_264,(char (*) [51])") must be 0 when explicit render pass is not used.");
    }
  }
  else {
    if (local_a0->NumRenderTargets != '\0') {
      local_180 = GetPipelineTypeString
                            ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
          (Char *)0x0) {
        local_2e0 = "";
      }
      else {
        local_2e0 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name
        ;
      }
      local_188 = local_2e0;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[62]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x25e,(char (*) [16])"Description of ",&local_180,(char (*) [7])0xc0e54c,
                 &local_188,(char (*) [15])"\' is invalid: ",
                 (char (*) [62])"NumRenderTargets must be 0 when explicit render pass is used.");
    }
    if (local_a0->DSVFormat != TEX_FORMAT_UNKNOWN) {
      local_190 = GetPipelineTypeString
                            ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
          (Char *)0x0) {
        local_2e8 = "";
      }
      else {
        local_2e8 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name
        ;
      }
      local_198 = local_2e8;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[72]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x260,(char (*) [16])"Description of ",&local_190,(char (*) [7])0xc0e54c,
                 &local_198,(char (*) [15])"\' is invalid: ",
                 (char (*) [72])
                 "DSVFormat must be TEX_FORMAT_UNKNOWN when explicit render pass is used.");
    }
    if ((local_a0->ReadOnlyDSV & 1U) != 0) {
      local_1a0 = GetPipelineTypeString
                            ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
          (Char *)0x0) {
        local_2f0 = "";
      }
      else {
        local_2f0 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name
        ;
      }
      pcStack_1a8 = local_2f0;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[61]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x262,(char (*) [16])"Description of ",&local_1a0,(char (*) [7])0xc0e54c,
                 &stack0xfffffffffffffe58,(char (*) [15])"\' is invalid: ",
                 (char (*) [61])"ReadOnlyDSV must be false when explicit render pass is used.");
    }
    for (local_1ac = 0; local_1ac < 8; local_1ac = local_1ac + 1) {
      if (local_a0->RTVFormats[local_1ac] != TEX_FORMAT_UNKNOWN) {
        local_1b8 = GetPipelineTypeString
                              ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
        if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
            (Char *)0x0) {
          local_2f8 = (RenderPassDesc *)0xc361e0;
        }
        else {
          local_2f8 = (RenderPassDesc *)
                      (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                      Name;
        }
        RPDesc = local_2f8;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[12],unsigned_int,char[64]>
                  (false,"ValidateGraphicsPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x267,(char (*) [16])"Description of ",&local_1b8,(char (*) [7])0xc0e54c,
                   (char **)&RPDesc,(char (*) [15])"\' is invalid: ",(char (*) [12])"RTVFormats[",
                   &local_1ac,
                   (char (*) [64])"] must be TEX_FORMAT_UNKNOWN when explicit render pass is used.")
        ;
      }
    }
    iVar2 = (*(local_a0->pRenderPass->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_1c8 = (char **)CONCAT44(extraout_var_13,iVar2);
    if (*(uint *)(local_1c8 + 3) <= (uint)local_a0->SubpassIndex) {
      local_1d0 = GetPipelineTypeString
                            ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
          (Char *)0x0) {
        local_300 = "";
      }
      else {
        local_300 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name
        ;
      }
      local_1d8 = local_300;
      rt_1 = (Uint32)local_a0->SubpassIndex;
      uStack_1e0 = *(uint *)(local_1c8 + 3);
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[16],unsigned_int,char[36],unsigned_int,char[19],char_const*,char[3]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x26c,(char (*) [16])"Description of ",&local_1d0,(char (*) [7])0xc0e54c,
                 &local_1d8,(char (*) [15])"\' is invalid: ",(char (*) [16])"Subpass index (",&rt_1,
                 (char (*) [36])") exceeds the number of subpasses (",&stack0xfffffffffffffe20,
                 (char (*) [19])") in render pass \'",local_1c8,(char (*) [3])"\'.");
    }
  }
  if (((CreateInfo->GraphicsPipeline).ShadingRateFlags != PIPELINE_SHADING_RATE_FLAG_NONE) &&
     (AdapterInfo->Description[0x27] == '\0')) {
    local_270 = GetPipelineTypeString
                          ((local_88->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    if ((local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
        (Char *)0x0) {
      local_348 = "";
    }
    else {
      local_348 = (local_88->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    }
    local_278 = local_348;
    GetPipelineShadingRateFlagsString_abi_cxx11_
              (&local_298,(Diligent *)(ulong)(CreateInfo->GraphicsPipeline).ShadingRateFlags,Flags);
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[19],std::__cxx11::string,char[38]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x29e,(char (*) [16])"Description of ",&local_270,(char (*) [7])0xc0e54c,&local_278,
               (char (*) [15])"\' is invalid: ",(char (*) [19])"ShadingRateFlags (",&local_298,
               (char (*) [38])") require VariableRateShading feature");
    std::__cxx11::string::~string((string *)&local_298);
  }
  return;
}

Assistant:

void ValidateGraphicsPipelineCreateInfo(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                        const IRenderDevice*                   pDevice) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    const DeviceFeatures&      Features    = pDevice->GetDeviceInfo().Features;
    const GraphicsAdapterInfo& AdapterInfo = pDevice->GetAdapterInfo();

    const PipelineStateDesc& PSODesc = CreateInfo.PSODesc;
    if (PSODesc.PipelineType != PIPELINE_TYPE_GRAPHICS && PSODesc.PipelineType != PIPELINE_TYPE_MESH)
        LOG_PSO_ERROR_AND_THROW("Pipeline type must be GRAPHICS or MESH.");

    ValidatePipelineResourceSignatures(CreateInfo, pDevice);

    const GraphicsPipelineDesc& GraphicsPipeline = CreateInfo.GraphicsPipeline;

    ValidateBlendStateDesc(PSODesc, GraphicsPipeline);
    ValidateRasterizerStateDesc(PSODesc, GraphicsPipeline, Features);
    ValidateDepthStencilDesc(PSODesc, GraphicsPipeline);
    ValidateGraphicsPipelineDesc(PSODesc, GraphicsPipeline, AdapterInfo.ShadingRate);
    ValidatePipelineResourceLayoutDesc(PSODesc, Features);


    if (PSODesc.PipelineType == PIPELINE_TYPE_GRAPHICS)
    {
        if (CreateInfo.pVS == nullptr)
            LOG_PSO_ERROR_AND_THROW("Vertex shader must not be null.");

        DEV_CHECK_ERR(CreateInfo.pAS == nullptr && CreateInfo.pMS == nullptr, "Mesh shaders are not supported in graphics pipeline.");
    }
    else if (PSODesc.PipelineType == PIPELINE_TYPE_MESH)
    {
        if (CreateInfo.pMS == nullptr)
            LOG_PSO_ERROR_AND_THROW("Mesh shader must not be null.");

        DEV_CHECK_ERR(CreateInfo.pVS == nullptr && CreateInfo.pGS == nullptr && CreateInfo.pDS == nullptr && CreateInfo.pHS == nullptr,
                      "Vertex, geometry and tessellation shaders are not supported in a mesh pipeline.");
        DEV_CHECK_ERR(GraphicsPipeline.InputLayout.NumElements == 0, "Input layout is ignored in a mesh pipeline.");
        DEV_CHECK_ERR(GraphicsPipeline.PrimitiveTopology == PRIMITIVE_TOPOLOGY_TRIANGLE_LIST ||
                          GraphicsPipeline.PrimitiveTopology == PRIMITIVE_TOPOLOGY_UNDEFINED,
                      "Primitive topology is ignored in a mesh pipeline, set it to undefined or keep default value (triangle list).");
    }


    VALIDATE_SHADER_TYPE(CreateInfo.pVS, SHADER_TYPE_VERTEX, "vertex")
    VALIDATE_SHADER_TYPE(CreateInfo.pPS, SHADER_TYPE_PIXEL, "pixel")
    VALIDATE_SHADER_TYPE(CreateInfo.pGS, SHADER_TYPE_GEOMETRY, "geometry")
    VALIDATE_SHADER_TYPE(CreateInfo.pHS, SHADER_TYPE_HULL, "hull")
    VALIDATE_SHADER_TYPE(CreateInfo.pDS, SHADER_TYPE_DOMAIN, "domain")
    VALIDATE_SHADER_TYPE(CreateInfo.pAS, SHADER_TYPE_AMPLIFICATION, "amplification")
    VALIDATE_SHADER_TYPE(CreateInfo.pMS, SHADER_TYPE_MESH, "mesh")


    if (GraphicsPipeline.pRenderPass != nullptr)
    {
        if (GraphicsPipeline.NumRenderTargets != 0)
            LOG_PSO_ERROR_AND_THROW("NumRenderTargets must be 0 when explicit render pass is used.");
        if (GraphicsPipeline.DSVFormat != TEX_FORMAT_UNKNOWN)
            LOG_PSO_ERROR_AND_THROW("DSVFormat must be TEX_FORMAT_UNKNOWN when explicit render pass is used.");
        if (GraphicsPipeline.ReadOnlyDSV)
            LOG_PSO_ERROR_AND_THROW("ReadOnlyDSV must be false when explicit render pass is used.");

        for (Uint32 rt = 0; rt < MAX_RENDER_TARGETS; ++rt)
        {
            if (GraphicsPipeline.RTVFormats[rt] != TEX_FORMAT_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("RTVFormats[", rt, "] must be TEX_FORMAT_UNKNOWN when explicit render pass is used.");
        }

        const RenderPassDesc& RPDesc = GraphicsPipeline.pRenderPass->GetDesc();
        if (GraphicsPipeline.SubpassIndex >= RPDesc.SubpassCount)
            LOG_PSO_ERROR_AND_THROW("Subpass index (", Uint32{GraphicsPipeline.SubpassIndex}, ") exceeds the number of subpasses (", Uint32{RPDesc.SubpassCount}, ") in render pass '", RPDesc.Name, "'.");
    }
    else
    {
        for (Uint32 rt = 0; rt < GraphicsPipeline.NumRenderTargets; ++rt)
        {
            const TEXTURE_FORMAT RTVFmt = GraphicsPipeline.RTVFormats[rt];
            if (RTVFmt == TEX_FORMAT_UNKNOWN)
                continue;

            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RTVFmt);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
            {
                LOG_PSO_ERROR_AND_THROW("Format ", FmtAttribs.Name, " of render target slot ", rt,
                                        " is invalid: depth-stencil or compressed formats are not allowed.");
            }
        }

        if (GraphicsPipeline.DSVFormat != TEX_FORMAT_UNKNOWN)
        {
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(GraphicsPipeline.DSVFormat);
            if (FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH &&
                FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)
            {
                LOG_PSO_ERROR_AND_THROW(FmtAttribs.Name, " is not a valid depth buffer format.");
            }

            if (GraphicsPipeline.ReadOnlyDSV && GraphicsPipeline.DepthStencilDesc.DepthWriteEnable)
                LOG_PSO_ERROR_AND_THROW("DepthStencilDesc.DepthWriteEnable can't be true when ReadOnlyDSV is true.");
        }

        for (Uint32 rt = GraphicsPipeline.NumRenderTargets; rt < _countof(GraphicsPipeline.RTVFormats); ++rt)
        {
            TEXTURE_FORMAT RTVFmt = GraphicsPipeline.RTVFormats[rt];
            if (RTVFmt != TEX_FORMAT_UNKNOWN)
            {
                LOG_WARNING_MESSAGE("Render target format (", GetTextureFormatAttribs(RTVFmt).Name, ") of unused slot ", rt,
                                    " must be set to TEX_FORMAT_UNKNOWN.");
            }
        }

        if (GraphicsPipeline.SubpassIndex != 0)
            LOG_PSO_ERROR_AND_THROW("Subpass index (", Uint32{GraphicsPipeline.SubpassIndex}, ") must be 0 when explicit render pass is not used.");
    }

    if (CreateInfo.GraphicsPipeline.ShadingRateFlags != PIPELINE_SHADING_RATE_FLAG_NONE)
    {
        if (!Features.VariableRateShading)
            LOG_PSO_ERROR_AND_THROW("ShadingRateFlags (", GetPipelineShadingRateFlagsString(CreateInfo.GraphicsPipeline.ShadingRateFlags), ") require VariableRateShading feature");
    }
}